

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O2

bool __thiscall jbcoin::STObject::operator==(STObject *this,STObject *obj)

{
  STBase **ppSVar1;
  pointer pSVar2;
  SField *pSVar3;
  int iVar4;
  int iVar5;
  pointer pSVar6;
  int iVar7;
  STVar *t1;
  pointer pSVar8;
  
  pSVar8 = (this->v_).
           super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>._M_impl
           .super__Vector_impl_data._M_start;
  pSVar2 = (this->v_).
           super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>._M_impl
           .super__Vector_impl_data._M_finish;
  iVar7 = 0;
  do {
    if (pSVar8 == pSVar2) {
      pSVar2 = (obj->v_).
               super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      iVar4 = 0;
      for (pSVar8 = (obj->v_).
                    super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>
                    ._M_impl.super__Vector_impl_data._M_start; pSVar8 != pSVar2; pSVar8 = pSVar8 + 1
          ) {
        iVar5 = (*pSVar8->p_->_vptr_STBase[4])();
        if (iVar5 != 0) {
          iVar4 = iVar4 + (uint)(pSVar8->p_->fName->fieldValue < 0x100);
        }
      }
      return iVar4 == iVar7;
    }
    iVar4 = (*pSVar8->p_->_vptr_STBase[4])();
    if ((iVar4 != 0) && (pSVar3 = pSVar8->p_->fName, pSVar3->fieldValue < 0x100)) {
      pSVar6 = (obj->v_).
               super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>.
               _M_impl.super__Vector_impl_data._M_start;
      do {
        if (pSVar6 == (obj->v_).
                      super__Vector_base<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>
                      ._M_impl.super__Vector_impl_data._M_finish) {
          return false;
        }
        ppSVar1 = &pSVar6->p_;
        pSVar6 = pSVar6 + 1;
      } while (pSVar3->fieldCode != (*ppSVar1)->fName->fieldCode);
      iVar4 = (*(*ppSVar1)->_vptr_STBase[9])();
      if ((char)iVar4 == '\0') {
        return false;
      }
      iVar7 = iVar7 + 1;
    }
    pSVar8 = pSVar8 + 1;
  } while( true );
}

Assistant:

bool STObject::operator== (const STObject& obj) const
{
    // This is not particularly efficient, and only compares data elements
    // with binary representations
    int matches = 0;
    for (auto const& t1 : v_)
    {
        if ((t1->getSType () != STI_NOTPRESENT) && t1->getFName ().isBinary ())
        {
            // each present field must have a matching field
            bool match = false;
            for (auto const& t2 : obj.v_)
            {
                if (t1->getFName () == t2->getFName ())
                {
                    if (t2 != t1)
                        return false;

                    match = true;
                    ++matches;
                    break;
                }
            }

            if (!match)
                return false;
        }
    }

    int fields = 0;
    for (auto const& t2 : obj.v_)
    {
        if ((t2->getSType () != STI_NOTPRESENT) && t2->getFName ().isBinary ())
            ++fields;
    }

    if (fields != matches)
        return false;

    return true;
}